

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

void resp0_ctx_cancel_send(nni_aio *aio,void *arg,int rv)

{
  nni_mtx *mtx;
  nni_msg *m;
  resp0_sock *s;
  resp0_ctx *ctx;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  if (*(nni_aio **)((long)arg + 0x18) == aio) {
    nni_list_node_remove((nni_list_node *)((long)arg + 0x28));
    *(undefined8 *)((long)arg + 0x18) = 0;
    nni_mtx_unlock(mtx);
    m = nni_aio_get_msg(aio);
    nni_msg_header_clear(m);
    nni_aio_finish_error(aio,rv);
  }
  else {
    nni_mtx_unlock(mtx);
  }
  return;
}

Assistant:

static void
resp0_ctx_cancel_send(nni_aio *aio, void *arg, int rv)
{
	resp0_ctx  *ctx = arg;
	resp0_sock *s   = ctx->sock;

	nni_mtx_lock(&s->mtx);
	if (ctx->saio != aio) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_list_node_remove(&ctx->sqnode);
	ctx->saio = NULL;
	nni_mtx_unlock(&s->mtx);
	nni_msg_header_clear(nni_aio_get_msg(aio)); // reset the headers
	nni_aio_finish_error(aio, rv);
}